

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

Plane<3> *
r3d::tet_face_from_verts(Plane<3> *__return_storage_ptr__,Vector<3> *a,Vector<3> *b,Vector<3> *c)

{
  Real RVar1;
  Vector<3> local_1c0;
  Vector<3> local_1a8;
  Real local_190;
  Real d;
  Vector<3> local_170;
  Vector<3> local_158;
  Vector<3> local_140;
  Vector<3> local_128;
  Vector<3> local_110;
  Vector<3> local_f8;
  undefined1 local_e0 [8];
  Vector<3> normal;
  Vector<3> local_a0;
  Vector<3> local_88;
  Vector<3> local_70;
  Vector<3> local_58;
  undefined1 local_40 [8];
  Vector<3> center;
  Vector<3> *c_local;
  Vector<3> *b_local;
  Vector<3> *a_local;
  
  center.super_Few<double,_3>.array_[2] = (UninitT)c;
  Vector<3>::Vector(&local_88,a);
  Vector<3>::Vector(&local_a0,b);
  operator+(&local_70,&local_88,&local_a0);
  Vector<3>::Vector((Vector<3> *)&normal.super_Few<double,_3>.array_[2].__align,c);
  operator+(&local_58,&local_70,(Vector<3> *)&normal.super_Few<double,_3>.array_[2].__align);
  operator*((Vector<3> *)local_40,0.3333333333333333,&local_58);
  Vector<3>::~Vector(&local_58);
  Vector<3>::~Vector((Vector<3> *)&normal.super_Few<double,_3>.array_[2].__align);
  Vector<3>::~Vector(&local_70);
  Vector<3>::~Vector(&local_a0);
  Vector<3>::~Vector(&local_88);
  Vector<3>::Vector(&local_128,b);
  Vector<3>::Vector(&local_140,a);
  operator-(&local_110,&local_128,&local_140);
  Vector<3>::Vector(&local_170,c);
  Vector<3>::Vector((Vector<3> *)&d,a);
  operator-(&local_158,&local_170,(Vector<3> *)&d);
  cross(&local_f8,&local_110,&local_158);
  normalize<3>((Vector<3> *)local_e0,&local_f8);
  Vector<3>::~Vector(&local_f8);
  Vector<3>::~Vector(&local_158);
  Vector<3>::~Vector((Vector<3> *)&d);
  Vector<3>::~Vector(&local_170);
  Vector<3>::~Vector(&local_110);
  Vector<3>::~Vector(&local_140);
  Vector<3>::~Vector(&local_128);
  Vector<3>::Vector(&local_1a8,(Vector<3> *)local_e0);
  Vector<3>::Vector(&local_1c0,(Vector<3> *)local_40);
  RVar1 = operator*(&local_1a8,&local_1c0);
  Vector<3>::~Vector(&local_1c0);
  Vector<3>::~Vector(&local_1a8);
  local_190 = -RVar1;
  Vector<3>::Vector(&__return_storage_ptr__->n,(Vector<3> *)local_e0);
  __return_storage_ptr__->d = local_190;
  Vector<3>::~Vector((Vector<3> *)local_e0);
  Vector<3>::~Vector((Vector<3> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Plane<3> tet_face_from_verts(Vector<3> a, Vector<3> b, Vector<3> c) {
  auto center = ONE_THIRD * (a + b + c);
  auto normal = normalize(cross((b - a), (c - a)));
  auto d = -(normal * center);
  return Plane<3>{normal, d};
}